

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O3

int parseconfig(char *filename,GlobalConfig *global)

{
  OperationConfig *pOVar1;
  GlobalConfig *pGVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  CURLcode CVar6;
  int iVar7;
  ParameterError res;
  int iVar8;
  char *pcVar9;
  FILE *__stream;
  char *pcVar10;
  size_t sVar11;
  byte *flag;
  ulong uVar12;
  OperationConfig *config;
  size_t sVar13;
  byte *nextarg;
  byte bVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  _Bool usedarg;
  dynbuf buf;
  char buf_1 [4096];
  _Bool local_108d;
  uint local_108c;
  OperationConfig *local_1088;
  byte *local_1080;
  char *local_1078;
  undefined8 local_1070;
  GlobalConfig *local_1068;
  char *local_1060;
  dynbuf local_1058;
  char local_1038 [4104];
  
  local_108d = false;
  pOVar1 = global->last;
  if (filename == (char *)0x0) {
    pcVar10 = homedir(".curlrc");
    if (pcVar10 == (char *)0x0) {
      iVar8 = 1;
      pcVar9 = (char *)0x0;
      goto LAB_00119878;
    }
LAB_001193be:
    pcVar9 = (char *)curl_maprintf("%s%s.curlrc",pcVar10,"/");
    free(pcVar10);
    filename = pcVar9;
    if (pcVar9 == (char *)0x0) {
      return 1;
    }
LAB_001193f9:
    cVar4 = *filename;
  }
  else {
    cVar4 = *filename;
    if (cVar4 == '\0') {
      pcVar10 = homedir(".curlrc");
      if (pcVar10 != (char *)0x0) goto LAB_001193be;
      pcVar9 = (char *)0x0;
      goto LAB_001193f9;
    }
    pcVar9 = (char *)0x0;
  }
  if ((cVar4 != '-') || (__stream = _stdin, filename[1] != '\0')) {
    __stream = fopen64(filename,"r");
  }
  if (__stream == (FILE *)0x0) {
    iVar8 = 1;
  }
  else {
    local_1088 = pOVar1;
    local_1078 = filename;
    local_1068 = global;
    local_1060 = pcVar9;
    curlx_dyn_init(&local_1058,0x19000);
    uVar15 = 0;
LAB_00119455:
    pcVar10 = fgets(local_1038,0x1000,__stream);
    if (pcVar10 == (char *)0x0) {
      sVar11 = curlx_dyn_len(&local_1058);
      if (sVar11 != 0) goto LAB_0011949f;
      iVar8 = 0;
    }
    else {
      CVar6 = curlx_dyn_add(&local_1058,local_1038);
      if (CVar6 == CURLE_OK) goto code_r0x0011947d;
      iVar8 = 1;
    }
LAB_0011984d:
    curlx_dyn_free(&local_1058);
    pcVar9 = local_1060;
    if (__stream != _stdin) {
      fclose(__stream);
      pcVar9 = local_1060;
    }
  }
LAB_00119878:
  curl_free(pcVar9);
  return iVar8;
code_r0x0011947d:
  pcVar10 = strchr(local_1038,10);
  if (pcVar10 == (char *)0x0) goto LAB_00119455;
LAB_0011949f:
  flag = (byte *)curlx_dyn_ptr(&local_1058);
  iVar8 = 1;
  if (flag == (byte *)0x0) goto LAB_0011984d;
  bVar14 = *flag;
  uVar15 = uVar15 + 1;
  pbVar16 = flag;
  uVar3 = local_108c;
  while (local_108c = uVar15, uVar15 = local_108c, bVar14 != 0) {
    pbVar16 = pbVar16 + 1;
    iVar7 = Curl_isspace((uint)bVar14);
    uVar3 = local_108c;
    if (iVar7 == 0) {
      bVar14 = *flag;
      uVar12 = (ulong)bVar14;
      if ((0x2f < uVar12) || (uVar15 = local_108c, (0x840800002401U >> (uVar12 & 0x3f) & 1) == 0))
      goto LAB_00119516;
      break;
    }
    pbVar18 = flag + 1;
    flag = flag + 1;
    uVar15 = local_108c;
    bVar14 = *pbVar18;
  }
  goto LAB_00119507;
  while( true ) {
    if ((bVar14 != 0x2d) && ((pbVar16[-1] == 0x3a || (pbVar16[-1] == 0x3d)))) goto LAB_0011954c;
    bVar5 = *pbVar16;
    uVar12 = (ulong)bVar5;
    pbVar16 = pbVar16 + 1;
    if (bVar5 == 0) break;
LAB_00119516:
    iVar7 = Curl_isspace((int)uVar12);
    if (iVar7 != 0) {
      if (pbVar16[-1] != 0) {
LAB_0011954c:
        pbVar16[-1] = 0;
        bVar5 = *pbVar16;
        if (bVar5 == 0) goto LAB_00119594;
        pbVar16 = pbVar16 + 1;
        goto LAB_00119559;
      }
      break;
    }
  }
  goto LAB_0011958c;
  while( true ) {
    bVar5 = *pbVar16;
    pbVar16 = pbVar16 + 1;
    if (bVar5 == 0) break;
LAB_00119559:
    iVar7 = Curl_isspace((uint)bVar5);
    if ((iVar7 == 0) &&
       ((bVar5 = pbVar16[-1], bVar14 == 0x2d || ((bVar5 != 0x3d && (bVar5 != 0x3a)))))) {
      local_1080 = pbVar16;
      if (bVar5 == 0x22) {
        sVar13 = strlen((char *)pbVar16);
        nextarg = (byte *)malloc(sVar13 + 1);
        pbVar18 = nextarg;
        pbVar17 = local_1080;
        if (nextarg != (byte *)0x0) {
          do {
            bVar14 = *pbVar17;
            pbVar17 = pbVar17 + 1;
            do {
              if (bVar14 != 0x5c) {
                if ((bVar14 != 0) && (bVar14 != 0x22)) goto switchD_001196ef_caseD_6f;
                *pbVar18 = 0;
                local_1070 = CONCAT71((int7)((ulong)pbVar16 >> 8),bVar5 == 0x22);
                goto LAB_001195aa;
              }
              bVar14 = *pbVar17;
              pbVar17 = pbVar17 + 1;
            } while (bVar14 == 0);
            switch(bVar14) {
            case 0x6e:
              bVar14 = 10;
              break;
            case 0x72:
              bVar14 = 0xd;
              break;
            case 0x74:
              bVar14 = 9;
              break;
            case 0x76:
              bVar14 = 0xb;
            }
switchD_001196ef_caseD_6f:
            *pbVar18 = bVar14;
            pbVar18 = pbVar18 + 1;
          } while( true );
        }
        goto LAB_0011984d;
      }
      pbVar16 = pbVar16 + -1;
      pbVar18 = pbVar16;
      goto joined_r0x00119727;
    }
  }
LAB_0011958c:
  pbVar16 = pbVar16 + -1;
LAB_00119594:
  local_1070 = 0;
  nextarg = (byte *)0x0;
  if (*pbVar16 != 0) {
    nextarg = pbVar16;
  }
LAB_001195aa:
  pGVar2 = local_1068;
  res = getparameter((char *)flag,(char *)nextarg,&local_108d,local_1068,local_1088);
  local_1088 = pGVar2->last;
  uVar15 = local_108c;
  if ((nextarg == (byte *)0x0) || (res != PARAM_OK)) {
    if (res != PARAM_OK) {
      if (res == PARAM_NEXT_OPERATION) {
        if ((local_1088->url_list != (getout *)0x0) && (local_1088->url_list->url != (char *)0x0)) {
          config = (OperationConfig *)malloc(0x538);
          pOVar1 = local_1088;
          local_1088->next = config;
          if (config == (OperationConfig *)0x0) {
            res = PARAM_NO_MEM;
            goto LAB_00119766;
          }
          config_init(config);
          local_1088 = pOVar1->next;
          local_1088->global = local_1068;
          local_1068->last = local_1088;
          local_1088->prev = pOVar1;
          uVar15 = local_108c;
        }
      }
      else {
LAB_00119766:
        uVar15 = local_108c;
        if ((*local_1078 == '-') && (local_1078[1] == '\0')) {
          local_1078 = "<stdin>";
        }
        if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
          pcVar10 = param2text(res);
          warnf(local_1088->global,"%s:%d: warning: \'%s\' %s\n",local_1078,(ulong)uVar15,flag,
                pcVar10);
        }
      }
    }
  }
  else if ((*nextarg != 0) && (res = PARAM_GOT_EXTRA_PARAMETER, local_108d == false))
  goto LAB_00119766;
  uVar3 = local_108c;
  if ((char)local_1070 != '\0') {
    free(nextarg);
    uVar3 = local_108c;
  }
LAB_00119507:
  local_108c = uVar3;
  curlx_dyn_reset(&local_1058);
  goto LAB_00119455;
joined_r0x00119727:
  if (bVar5 == 0) goto LAB_00119594;
  iVar8 = Curl_isspace((uint)bVar5);
  if (iVar8 != 0) {
    if (*pbVar18 != 0) {
      *pbVar18 = 0;
      pbVar18 = local_1080;
      goto LAB_001197e5;
    }
    goto LAB_00119594;
  }
  bVar5 = pbVar18[1];
  pbVar18 = pbVar18 + 1;
  local_1080 = local_1080 + 1;
  goto joined_r0x00119727;
  while( true ) {
    iVar8 = Curl_isspace((uint)*pbVar17);
    pbVar18 = pbVar17 + 1;
    if (iVar8 == 0) break;
LAB_001197e5:
    pbVar17 = pbVar18;
    if (*pbVar17 == 0) goto LAB_00119594;
  }
  if ((0x23 < (ulong)*pbVar17) || ((0x800002401U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)) {
    warnf(local_1088->global,
          "%s:%d: warning: \'%s\' uses unquoted whitespace in the line that may cause side-effects!\n"
          ,local_1078,(ulong)local_108c,flag);
  }
  goto LAB_00119594;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file = NULL;
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->last;
  char *pathalloc = NULL;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

    char *home = homedir(".curlrc");
#ifndef WIN32
    if(home) {
      pathalloc = curl_maprintf("%s%s.curlrc", home, DIR_CHAR);
      if(!pathalloc) {
        free(home);
        return 1; /* out of memory */
      }
      filename = pathalloc;
    }
#else /* Windows */
    if(home) {
      int i = 0;
      char prefix = '.';
      do {
        /* if it was allocated in a previous attempt */
        curl_free(pathalloc);
        /* check for .curlrc then _curlrc in the home dir */
        pathalloc = curl_maprintf("%s%s%ccurlrc", home, DIR_CHAR, prefix);
        if(!pathalloc) {
          free(home);
          return 1; /* out of memory */
        }

        /* Check if the file exists - if not, try _curlrc */
        file = fopen(pathalloc, FOPEN_READTEXT);
        if(file) {
          filename = pathalloc;
          break;
        }
        prefix = '_';
      } while(++i < 2);
    }
    if(!filename) {
      /* check for .curlrc then _curlrc in the dir of the executable */
      file = execpath(".curlrc");
      if(!file)
        file = execpath("_curlrc");
    }
#endif

    Curl_safefree(home); /* we've used it, now free it */
  }

  if(!file && filename) { /* no need to fopen() again */
    if(strcmp(filename, "-"))
      file = fopen(filename, FOPEN_READTEXT);
    else
      file = stdin;
  }

  if(file) {
    char *line;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;
    struct curlx_dynbuf buf;
    bool fileerror;
    curlx_dyn_init(&buf, MAX_CONFIG_LINE_LENGTH);

    while(my_get_line(file, &buf, &fileerror)) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = curlx_dyn_ptr(&buf);
      if(!line) {
        rc = 1; /* out of memory */
        break;
      }

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        curlx_dyn_reset(&buf);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* null-terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* null-terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "whitespace in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);
      operation = global->last;

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      curlx_dyn_reset(&buf);
    }
    curlx_dyn_free(&buf);
    if(file != stdin)
      fclose(file);
    if(fileerror)
      rc = 1;
  }
  else
    rc = 1; /* couldn't open the file */

  curl_free(pathalloc);
  return rc;
}